

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha.c
# Opt level: O1

uint64_t tail64_le(void *v,size_t tail)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  switch((uint)tail & 7) {
  case 0:
    return *v;
  case 1:
    return (ulong)*v;
  case 3:
    uVar3 = (ulong)*(byte *)((long)v + 2) << 0x10;
  case 2:
    uVar1 = (ulong)*v;
    break;
  case 7:
    uVar2 = (uint)*(byte *)((long)v + 6) << 8;
  case 6:
    uVar2 = (uVar2 | *(byte *)((long)v + 5)) << 8;
  case 5:
    uVar3 = (ulong)(uVar2 | *(byte *)((long)v + 4)) << 0x20;
  case 4:
    uVar1 = (ulong)*v;
  }
  return uVar1 | uVar3;
}

Assistant:

static __inline uint64_t tail64_le(const void *v, size_t tail) {
  const uint8_t *p = (const uint8_t *)v;
  uint64_t r = 0;
  switch (tail & 7) {
#if UNALIGNED_OK && __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
  /* For most CPUs this code is better when not needed
   * copying for alignment or byte reordering. */
  case 0:
    return fetch64_le(p);
  case 7:
    r = (uint64_t)p[6] << 8;
  case 6:
    r += p[5];
    r <<= 8;
  case 5:
    r += p[4];
    r <<= 32;
  case 4:
    return r + fetch32_le(p);
  case 3:
    r = (uint64_t)p[2] << 16;
  case 2:
    return r + fetch16_le(p);
  case 1:
    return p[0];
#else
  /* For most CPUs this code is better than a
   * copying for alignment and/or byte reordering. */
  case 0:
    r = p[7] << 8;
  case 7:
    r += p[6];
    r <<= 8;
  case 6:
    r += p[5];
    r <<= 8;
  case 5:
    r += p[4];
    r <<= 8;
  case 4:
    r += p[3];
    r <<= 8;
  case 3:
    r += p[2];
    r <<= 8;
  case 2:
    r += p[1];
    r <<= 8;
  case 1:
    return r + p[0];
#endif
  }
  unreachable();
}